

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void printSentenceVectors
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  Vector svec;
  FastText fasttext;
  Vector *in_stack_00000170;
  istream *in_stack_00000178;
  FastText *in_stack_00000180;
  string *in_stack_000001a8;
  FastText *in_stack_000001b0;
  int64_t in_stack_ffffffffffffff18;
  Vector *in_stack_ffffffffffffff20;
  Vector *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  FastText *in_stack_ffffffffffffff50;
  string local_a8 [168];
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar2 != 3) {
    printPrintSentenceVectorsUsage();
    exit(1);
  }
  ::fasttext::FastText::FastText(in_stack_ffffffffffffff50);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_a8,(string *)pvVar3);
  ::fasttext::FastText::loadModel(in_stack_000001b0,in_stack_000001a8);
  std::__cxx11::string::~string(local_a8);
  ::fasttext::FastText::getDimension((FastText *)0x17138b);
  ::fasttext::Vector::Vector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) break;
    ::fasttext::FastText::getSentenceVector(in_stack_00000180,in_stack_00000178,in_stack_00000170);
    this = ::fasttext::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  exit(0);
}

Assistant:

void printSentenceVectors(const std::vector<std::string> args) {
  if (args.size() != 3) {
    printPrintSentenceVectorsUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  Vector svec(fasttext.getDimension());
  while (std::cin.peek() != EOF) {
    fasttext.getSentenceVector(std::cin, svec);
    // Don't print sentence
    std::cout << svec << std::endl;
  }
  exit(0);
}